

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffgbyt(fitsfile *fptr,LONGLONG nbytes,void *buffer,int *status)

{
  long position;
  size_t local_80;
  void *local_78;
  char *cptr;
  long nread;
  long nspace;
  long bufpos;
  long ntodo;
  long recend;
  long recstart;
  LONGLONG filepos;
  int ii;
  int *status_local;
  void *buffer_local;
  LONGLONG nbytes_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (nbytes < 0x21c0) {
      if (fptr->Fptr->curbuf < 0) {
        ffldrc(fptr,fptr->Fptr->bytepos / 0xb40,0,status);
      }
      nspace = fptr->Fptr->bytepos + fptr->Fptr->bufrecnum[fptr->Fptr->curbuf] * -0xb40;
      nread = 0xb40 - nspace;
      local_78 = buffer;
      bufpos = nbytes;
      while (bufpos != 0) {
        if (bufpos < nread) {
          local_80 = bufpos;
        }
        else {
          local_80 = nread;
        }
        memcpy(local_78,fptr->Fptr->iobuffer + nspace + fptr->Fptr->curbuf * 0xb40,local_80);
        bufpos = bufpos - local_80;
        local_78 = (void *)(local_80 + (long)local_78);
        fptr->Fptr->bytepos = local_80 + fptr->Fptr->bytepos;
        if (bufpos != 0) {
          ffldrc(fptr,fptr->Fptr->bytepos / 0xb40,0,status);
          nspace = 0;
          nread = 0xb40;
        }
      }
    }
    else {
      position = fptr->Fptr->bytepos;
      for (filepos._4_4_ = 0; filepos._4_4_ < 0x28; filepos._4_4_ = filepos._4_4_ + 1) {
        if (((fptr->Fptr->dirty[filepos._4_4_] != 0) &&
            (position / 0xb40 <= fptr->Fptr->bufrecnum[filepos._4_4_])) &&
           (fptr->Fptr->bufrecnum[filepos._4_4_] <= (position + nbytes + -1) / 0xb40)) {
          ffbfwt(fptr->Fptr,filepos._4_4_,status);
        }
      }
      if (fptr->Fptr->io_pos != position) {
        ffseek(fptr->Fptr,position);
      }
      ffread(fptr->Fptr,nbytes,buffer,status);
      fptr->Fptr->io_pos = position + nbytes;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgbyt(fitsfile *fptr,    /* I - FITS file pointer             */
           LONGLONG nbytes,       /* I - number of bytes to read       */
           void *buffer,      /* O - buffer to read into           */
           int *status)       /* IO - error status                 */
/*
  get (read) the requested number of bytes from the file, starting at
  the current file position.  Read large blocks of data directly from disk;
  read smaller segments via intermediate IO buffers to improve efficiency.
*/
{
    int ii;
    LONGLONG filepos;
    long recstart, recend, ntodo, bufpos, nspace, nread;
    char *cptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    cptr = (char *)buffer;

    if (nbytes >= MINDIRECT)
    {
      /* read large blocks of data directly from disk instead of via buffers */
      filepos = (fptr->Fptr)->bytepos; /* save the read starting position */

/*  note that in this case, ffmbyt has not been called, and so        */
/*  bufrecnum[(fptr->Fptr)->curbuf] does not point to the intended */
/*  output buffer */

      recstart = (long) (filepos / IOBUFLEN);               /* starting record */
      recend = (long) ((filepos + nbytes - 1) / IOBUFLEN);  /* ending record   */

      for (ii = 0; ii < NIOBUF; ii++) /* flush any affected buffers to disk */
      {
        if ((fptr->Fptr)->dirty[ii] && 
            (fptr->Fptr)->bufrecnum[ii] >= recstart && (fptr->Fptr)->bufrecnum[ii] <= recend)
            {
              ffbfwt(fptr->Fptr, ii, status);    /* flush modified buffer to disk */
            }
      }

       /* move to the correct read position */
      if ((fptr->Fptr)->io_pos != filepos)
         ffseek(fptr->Fptr, filepos);

      ffread(fptr->Fptr, (long) nbytes, cptr, status); /* read the data */
      (fptr->Fptr)->io_pos = filepos + nbytes; /* update the file position */
    }
    else
    {
      /* read small chucks of data using the IO buffers for efficiency */

      if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
      {                              /* so reload the last one that was used */
        ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
      }

      /* bufpos is the starting position in IO buffer */
      bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)(fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf] *
                IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      ntodo =  (long) nbytes;
      while (ntodo)
      {
        nread  = minvalue(ntodo, nspace);

        /* copy bytes from IO buffer to user's buffer */
        memcpy(cptr, (fptr->Fptr)->iobuffer + ((fptr->Fptr)->curbuf * IOBUFLEN) + bufpos, nread);
        ntodo -= nread;            /* decrement remaining number of bytes */
        cptr  += nread;
        (fptr->Fptr)->bytepos += nread;    /* increment file position pointer */

        if (ntodo)                  /* load next record into a buffer */
        {
          ffldrc(fptr, (long) ((fptr->Fptr)->bytepos / IOBUFLEN), REPORT_EOF, status);
          bufpos = 0;
          nspace = IOBUFLEN;
        }
      }
    }

    return(*status);
}